

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

PolicyStatus __thiscall cmMakefile::GetPolicyStatus(cmMakefile *this,PolicyID id)

{
  PolicyStatus PVar1;
  PolicyStatus def;
  PolicyStatus cur;
  PolicyID id_local;
  cmMakefile *this_local;
  
  PVar1 = GetPolicyStatusInternal(this,id);
  this_local._4_4_ = PVar1;
  if ((PVar1 == NEW) ||
     ((((PVar1 != REQUIRED_ALWAYS && (PVar1 != REQUIRED_IF_USED)) &&
       (this_local._4_4_ = cmPolicies::GetPolicyStatus(id), this_local._4_4_ != REQUIRED_ALWAYS)) &&
      (this_local._4_4_ != REQUIRED_IF_USED)))) {
    this_local._4_4_ = PVar1;
  }
  return this_local._4_4_;
}

Assistant:

cmPolicies::PolicyStatus
cmMakefile::GetPolicyStatus(cmPolicies::PolicyID id) const
{
  // Get the current setting of the policy.
  cmPolicies::PolicyStatus cur = this->GetPolicyStatusInternal(id);

  // If the policy is required to be set to NEW but is not, ignore the
  // current setting and tell the caller.
  if(cur != cmPolicies::NEW)
    {
    if(cur == cmPolicies::REQUIRED_ALWAYS ||
       cur == cmPolicies::REQUIRED_IF_USED)
      {
      return cur;
      }
    cmPolicies::PolicyStatus def = cmPolicies::GetPolicyStatus(id);
    if(def == cmPolicies::REQUIRED_ALWAYS ||
       def == cmPolicies::REQUIRED_IF_USED)
      {
      return def;
      }
    }

  // The current setting is okay.
  return cur;
}